

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_all_coc
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  long lVar1;
  OPJ_UINT32 *pOVar2;
  opj_tccp_t *poVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  OPJ_BYTE *p_buffer;
  OPJ_SIZE_T OVar6;
  opj_tccp_t *l_tccp0;
  OPJ_UINT32 p_comp_no;
  ulong uVar7;
  opj_event_mgr *in_R9;
  ulong uVar8;
  uint uVar9;
  OPJ_UINT32 local_64;
  opj_stream_private *local_60;
  opj_event_mgr *local_58;
  ulong local_50;
  opj_tcp_t *local_48;
  long local_40;
  long local_38;
  
  local_60 = p_stream;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x15b7,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager == (opj_event_mgr *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x15b8,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_stream == (opj_stream_private *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x15b9,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  uVar8 = 1;
  local_38 = 0x7e8;
  local_58 = p_manager;
  do {
    uVar9 = p_j2k->m_private_image->numcomps;
    if (uVar9 <= uVar8) {
      return 1;
    }
    poVar3 = (p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].tccps;
    local_40 = uVar8 * 0x438;
    if ((((poVar3->csty == poVar3[uVar8].csty) &&
         (poVar3->numresolutions == poVar3[uVar8].numresolutions)) &&
        (poVar3->cblkw == poVar3[uVar8].cblkw)) &&
       (((poVar3->cblkh == poVar3[uVar8].cblkh && (poVar3->cblksty == poVar3[uVar8].cblksty)) &&
        (poVar3->qmfbid == poVar3[uVar8].qmfbid)))) {
      uVar7 = 0;
      do {
        if (poVar3->numresolutions == uVar7) goto LAB_00120014;
        in_R9 = (opj_event_mgr *)(ulong)poVar3->prcw[uVar7];
        if (poVar3->prcw[uVar7] != *(uint *)((long)poVar3 + uVar7 * 4 + local_38 + -0x84)) break;
        pOVar2 = poVar3->prch + uVar7;
        in_R9 = (opj_event_mgr *)(ulong)*pOVar2;
        lVar1 = uVar7 * 4;
        uVar7 = uVar7 + 1;
      } while (*pOVar2 == *(uint *)((long)poVar3->stepsizes + lVar1 + local_38 + -0x1c));
    }
    p_comp_no = (OPJ_UINT32)uVar8;
    OVar5 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_j2k->m_current_tile_number,p_comp_no);
    uVar9 = OVar5 + (7 - (uint)(uVar9 < 0x101));
    uVar7 = (ulong)uVar9;
    p_buffer = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar9) {
      p_buffer = (OPJ_BYTE *)opj_realloc(p_buffer,uVar7);
      if (p_buffer == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = 0;
        opj_event_msg(p_manager,1,"Not enough memory to write COC marker\n");
        return 0;
      }
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = p_buffer;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar9;
    }
    local_48 = (p_j2k->m_cp).tcps;
    local_50 = (ulong)p_j2k->m_current_tile_number;
    iVar4 = -(uint)(p_j2k->m_private_image->numcomps < 0x101);
    uVar9 = iVar4 + 2;
    OVar5 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_j2k->m_current_tile_number,p_comp_no);
    opj_write_bytes_LE(p_buffer,0xff53,2);
    opj_write_bytes_LE(p_buffer + 2,OVar5 + uVar9 + 3,2);
    opj_write_bytes_LE(p_buffer + 4,p_comp_no,uVar9);
    opj_write_bytes_LE(p_buffer + (ulong)uVar9 + 4,
                       *(OPJ_UINT32 *)
                        ((long)(local_48[local_50].tccps)->stepsizes + local_40 + -0x1c),1);
    p_manager = local_58;
    local_64 = OVar5;
    opj_j2k_write_SPCod_SPCoc
              (p_j2k,p_j2k->m_current_tile_number,iVar4 + 7 + (int)p_buffer,(OPJ_BYTE *)&local_64,
               (OPJ_UINT32 *)local_58,in_R9);
    OVar6 = opj_stream_write_data
                      (local_60,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar7,
                       p_manager);
    if (OVar6 != uVar7) {
      return 0;
    }
LAB_00120014:
    uVar8 = uVar8 + 1;
    local_38 = local_38 + 0x438;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_j2k_write_all_coc(
    opj_j2k_t *p_j2k,
    struct opj_stream_private *p_stream,
    struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 compno;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    for (compno = 1; compno < p_j2k->m_private_image->numcomps; ++compno) {
        /* cod is first component of first tile */
        if (! opj_j2k_compare_coc(p_j2k, 0, compno)) {
            if (! opj_j2k_write_coc(p_j2k, compno, p_stream, p_manager)) {
                return OPJ_FALSE;
            }
        }
    }

    return OPJ_TRUE;
}